

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_rename(LIBSSH2_SFTP *sftp,char *source_filename,uint source_filename_len,
               char *dest_filename,uint dest_filename_len,long flags)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  ssize_t rc;
  uchar *data;
  uint local_60;
  uint32_t packet_len;
  int posix;
  int retcode;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  long flags_local;
  char *pcStack_30;
  uint dest_filename_len_local;
  char *dest_filename_local;
  char *pcStack_20;
  uint source_filename_len_local;
  char *source_filename_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  _posix = 0;
  local_60 = (uint)flags & 8;
  rc = 0;
  if ((flags & 8U) == 0) {
    iVar3 = 0;
    if (4 < sftp->version) {
      iVar3 = 4;
    }
    data._4_4_ = source_filename_len + dest_filename_len + 0x11 + iVar3;
  }
  else {
    data._4_4_ = source_filename_len + dest_filename_len + 0x2d;
  }
  channel = (LIBSSH2_CHANNEL *)flags;
  flags_local._4_4_ = dest_filename_len;
  pcStack_30 = dest_filename;
  dest_filename_local._4_4_ = source_filename_len;
  pcStack_20 = source_filename;
  source_filename_local = (char *)sftp;
  if (sftp->rename_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    if (sftp->version < 2) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Server does not support RENAME");
      return iVar3;
    }
    pvVar4 = (*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)data._4_4_,(void **)data_len);
    *(void **)(source_filename_local + 0xf8) = pvVar4;
    *(void **)(source_filename_local + 0x100) = pvVar4;
    if (*(long *)(source_filename_local + 0xf8) == 0) {
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_RENAME packet");
      return iVar3;
    }
    _libssh2_store_u32((uchar **)(source_filename_local + 0x100),data._4_4_ - 4);
    uVar2 = 0x12;
    if (local_60 != 0) {
      uVar2 = 200;
    }
    puVar1 = *(undefined1 **)(source_filename_local + 0x100);
    *(undefined1 **)(source_filename_local + 0x100) = puVar1 + 1;
    *puVar1 = uVar2;
    iVar3 = *(int *)(source_filename_local + 8);
    *(int *)(source_filename_local + 8) = iVar3 + 1;
    *(int *)(source_filename_local + 0x108) = iVar3;
    _libssh2_store_u32((uchar **)(source_filename_local + 0x100),
                       *(uint32_t *)(source_filename_local + 0x108));
    if (local_60 != 0) {
      _libssh2_store_str((uchar **)(source_filename_local + 0x100),"posix-rename@openssh.com",0x18);
    }
    _libssh2_store_str((uchar **)(source_filename_local + 0x100),pcStack_20,
                       (ulong)dest_filename_local._4_4_);
    _libssh2_store_str((uchar **)(source_filename_local + 0x100),pcStack_30,(ulong)flags_local._4_4_
                      );
    if ((4 < *(uint *)(source_filename_local + 0xc)) && (local_60 == 0)) {
      _libssh2_store_u32((uchar **)(source_filename_local + 0x100),(uint32_t)channel);
    }
    source_filename_local[0xf4] = '\x02';
    source_filename_local[0xf5] = '\0';
    source_filename_local[0xf6] = '\0';
    source_filename_local[0xf7] = '\0';
  }
  if (*(int *)(source_filename_local + 0xf4) == 2) {
    uVar5 = _libssh2_channel_write
                      ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(source_filename_local + 0xf8),
                       *(long *)(source_filename_local + 0x100) -
                       *(long *)(source_filename_local + 0xf8));
    if (uVar5 == 0xffffffffffffffdb) {
      return -0x25;
    }
    if (data._4_4_ != uVar5) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(source_filename_local + 0xf8),data_len);
      source_filename_local[0xf8] = '\0';
      source_filename_local[0xf9] = '\0';
      source_filename_local[0xfa] = '\0';
      source_filename_local[0xfb] = '\0';
      source_filename_local[0xfc] = '\0';
      source_filename_local[0xfd] = '\0';
      source_filename_local[0xfe] = '\0';
      source_filename_local[0xff] = '\0';
      source_filename_local[0xf4] = '\0';
      source_filename_local[0xf5] = '\0';
      source_filename_local[0xf6] = '\0';
      source_filename_local[0xf7] = '\0';
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"Unable to send FXP_RENAME command");
      return iVar3;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(source_filename_local + 0xf8),data_len);
    source_filename_local[0xf8] = '\0';
    source_filename_local[0xf9] = '\0';
    source_filename_local[0xfa] = '\0';
    source_filename_local[0xfb] = '\0';
    source_filename_local[0xfc] = '\0';
    source_filename_local[0xfd] = '\0';
    source_filename_local[0xfe] = '\0';
    source_filename_local[0xff] = '\0';
    source_filename_local[0xf4] = '\x03';
    source_filename_local[0xf5] = '\0';
    source_filename_local[0xf6] = '\0';
    source_filename_local[0xf7] = '\0';
  }
  iVar3 = sftp_packet_require((LIBSSH2_SFTP *)source_filename_local,'e',
                              *(uint32_t *)(source_filename_local + 0x108),(uchar **)&rc,
                              (size_t *)&posix,9);
  if (iVar3 == -0x25) {
    sftp_local._4_4_ = 0xffffffdb;
  }
  else if (iVar3 == -0x26) {
    if (_posix != 0) {
      (**(code **)(data_len + 0x18))(rc,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP rename packet too short");
  }
  else if (iVar3 == 0) {
    source_filename_local[0xf4] = '\0';
    source_filename_local[0xf5] = '\0';
    source_filename_local[0xf6] = '\0';
    source_filename_local[0xf7] = '\0';
    packet_len = _libssh2_ntohu32((uchar *)(rc + 5));
    (**(code **)(data_len + 0x18))(rc);
    *(uint32_t *)(source_filename_local + 0x48) = packet_len;
    if (packet_len == 0) {
      packet_len = 0;
    }
    else if (packet_len == 8) {
      packet_len = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Operation Not Supported");
    }
    else if (packet_len == 0xb) {
      packet_len = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,
                                  "File already exists and SSH_FXP_RENAME_OVERWRITE not specified");
    }
    else {
      packet_len = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
    sftp_local._4_4_ = packet_len;
  }
  else {
    source_filename_local[0xf4] = '\0';
    source_filename_local[0xf5] = '\0';
    source_filename_local[0xf6] = '\0';
    source_filename_local[0xf7] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar3,"Error waiting for FXP STATUS");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_rename(LIBSSH2_SFTP *sftp, const char *source_filename,
                       unsigned int source_filename_len,
                       const char *dest_filename,
                       unsigned int dest_filename_len, long flags)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    int retcode;
    int posix = flags & LIBSSH2_SFTP_RENAME_POSIX;
    uint32_t packet_len;
    unsigned char *data = NULL;
    ssize_t rc;
    if(posix) {
        packet_len = source_filename_len + dest_filename_len + 45;
         /* packet_len(4) + packet_type(1) + request_id(4) +
            "posix-rename@openssh.com"(24+4) +               
            source_filename_len(4) + dest_filename_len(4) */ 
    } else {
        /* packet_len(4) + packet_type(1) + request_id(4) +
           source_filename_len(4) + dest_filename_len(4) + 
           flags(4){SFTP5+) */
        packet_len = source_filename_len + dest_filename_len + 17 +
                     (sftp->version >= 5 ? 4 : 0);
    }

    if(sftp->rename_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        if(sftp->version < 2) {
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "Server does not support RENAME");
        }

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "Renaming %s to %s",
                       source_filename, dest_filename));
        sftp->rename_s = sftp->rename_packet =
            LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->rename_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_RENAME "
                                  "packet");
        }

        _libssh2_store_u32(&sftp->rename_s, packet_len - 4);
        *(sftp->rename_s++) = posix ? SSH_FXP_EXTENDED : SSH_FXP_RENAME;
        sftp->rename_request_id = sftp->request_id++;
        _libssh2_store_u32(&sftp->rename_s, sftp->rename_request_id);
        if(posix) {
          _libssh2_store_str(&sftp->rename_s, "posix-rename@openssh.com", 24);
        }
        _libssh2_store_str(&sftp->rename_s, source_filename,
                           source_filename_len);
        _libssh2_store_str(&sftp->rename_s, dest_filename, dest_filename_len);

        if(sftp->version >= 5 && !posix)
            _libssh2_store_u32(&sftp->rename_s, (uint32_t)flags);

        sftp->rename_state = libssh2_NB_state_created;
    }

    if(sftp->rename_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, sftp->rename_packet,
                                    sftp->rename_s - sftp->rename_packet);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if((ssize_t)packet_len != rc) {
            LIBSSH2_FREE(session, sftp->rename_packet);
            sftp->rename_packet = NULL;
            sftp->rename_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send FXP_RENAME command");
        }
        LIBSSH2_FREE(session, sftp->rename_packet);
        sftp->rename_packet = NULL;

        sftp->rename_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_require(sftp, SSH_FXP_STATUS,
                             sftp->rename_request_id, &data,
                             &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP rename packet too short");
    }
    else if(rc) {
        sftp->rename_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP STATUS");
    }

    sftp->rename_state = libssh2_NB_state_idle;

    retcode = _libssh2_ntohu32(data + 5);
    LIBSSH2_FREE(session, data);

    sftp->last_errno = retcode;

    /* now convert the SFTP error code to libssh2 return code or error
       message */
    switch(retcode) {
    case LIBSSH2_FX_OK:
        retcode = LIBSSH2_ERROR_NONE;
        break;

    case LIBSSH2_FX_FILE_ALREADY_EXISTS:
        retcode = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                 "File already exists and "
                                 "SSH_FXP_RENAME_OVERWRITE not specified");
        break;

    case LIBSSH2_FX_OP_UNSUPPORTED:
        retcode = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                 "Operation Not Supported");
        break;

    default:
        retcode = _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                 "SFTP Protocol Error");
        break;
    }

    return retcode;
}